

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

int cuddP(DdManager *dd,DdNode *f)

{
  int iVar1;
  st__table *t;
  
  t = st__init_table(st__ptrcmp,st__ptrhash);
  if (t == (st__table *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = dp2(dd,f,t);
    st__free_table(t);
    fputc(10,(FILE *)dd->out);
  }
  return iVar1;
}

Assistant:

int
cuddP(
  DdManager * dd,
  DdNode * f)
{
    int retval;
    st__table *table = st__init_table( st__ptrcmp, st__ptrhash);

    if (table == NULL) return(0);

    retval = dp2(dd,f,table);
    st__free_table(table);
    (void) fputc('\n',dd->out);
    return(retval);

}